

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O2

void boost::deflate::inflate_stream_test::testWrappedStreams(void)

{
  anon_class_8_1_ba1d7388 test;
  string raw;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw,"This is fake content",(allocator<char> *)&test);
  test.raw = &raw;
  testWrappedStreams::anon_class_8_1_ba1d7388::operator()(&test,zlib);
  testWrappedStreams::anon_class_8_1_ba1d7388::operator()(&test,gzip);
  std::__cxx11::string::~string((string *)&raw);
  return;
}

Assistant:

static void testWrappedStreams() {
        std::string raw = "This is fake content";
        auto test = [&](wrap wrap) {

          std::string in = compress(raw, 8, 10, wrap, 1, Z_DEFAULT_STRATEGY);
          std::string out;
          out.resize(raw.size());

          z_params zs = {};
          inflate_stream is{};
          is.reset(10, wrap, true);
          error_code ec;

          zs.next_in = &*in.begin();
          zs.next_out = &out[0];
          zs.avail_in = in.size();
          zs.avail_out = out.size();

          while (zs.avail_in > 0 && !ec) {
              is.write(zs, Flush::sync, ec);
              auto n = zs.avail_in;
              zs.next_in = static_cast<char const *>(zs.next_in) + n;
              zs.avail_in -= n;
          }

          BOOST_TEST(out == raw);
        };

        test(boost::deflate::wrap::zlib);
        test(boost::deflate::wrap::gzip);
    }